

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O0

void __thiscall sf::Transformable::Transformable(Transformable *this)

{
  Transformable *this_local;
  
  this->_vptr_Transformable = (_func_int **)&PTR__Transformable_00333190;
  Vector2<float>::Vector2(&this->m_origin,0.0,0.0);
  Vector2<float>::Vector2(&this->m_position,0.0,0.0);
  this->m_rotation = 0.0;
  Vector2<float>::Vector2(&this->m_scale,1.0,1.0);
  Transform::Transform(&this->m_transform);
  this->m_transformNeedUpdate = true;
  Transform::Transform(&this->m_inverseTransform);
  this->m_inverseTransformNeedUpdate = true;
  return;
}

Assistant:

Transformable::Transformable() :
m_origin                    (0, 0),
m_position                  (0, 0),
m_rotation                  (0),
m_scale                     (1, 1),
m_transform                 (),
m_transformNeedUpdate       (true),
m_inverseTransform          (),
m_inverseTransformNeedUpdate(true)
{
}